

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O1

string * __thiscall
banksia::WbEngine::timeLeftString_abi_cxx11_(string *__return_storage_ptr__,WbEngine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TimeControlMode TVar2;
  Side sd;
  GameTimeController *this_00;
  long lVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  double dVar17;
  string s;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  
  this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
  TVar2 = (this_00->super_TimeController).mode;
  if (TVar2 != standard) {
    if (TVar2 != movetime) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    uVar14 = (uint)((this_00->super_TimeController).time * 100.0);
    uVar16 = -uVar14;
    if (0 < (int)uVar14) {
      uVar16 = uVar14;
    }
    uVar15 = 1;
    if (9 < uVar16) {
      uVar11 = (ulong)uVar16;
      uVar4 = 4;
      do {
        uVar15 = uVar4;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_0017c985;
        }
        if (uVar7 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_0017c985;
        }
        if (uVar7 < 10000) goto LAB_0017c985;
        uVar11 = uVar11 / 10000;
        uVar4 = uVar15 + 4;
      } while (99999 < uVar7);
      uVar15 = uVar15 + 1;
    }
LAB_0017c985:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar15 - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_b8._M_dataplus._M_p + (uVar14 >> 0x1f),uVar15,uVar16);
    std::operator+(&local_58,"time ",&local_b8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_88 = *plVar8;
      lStack_80 = plVar5[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar8;
      local_98 = (long *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    _Var13._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0017caa2;
  }
  sd = (((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore).side;
  dVar17 = GameTimeController::getTimeLeft(this_00,sd);
  uVar14 = (uint)(dVar17 * 100.0);
  uVar15 = 1;
  local_38 = GameTimeController::getTimeLeft
                       ((this->super_EngineProfile).super_Engine.super_Player.timeController,1 - sd)
  ;
  uVar16 = -uVar14;
  if (0 < (int)uVar14) {
    uVar16 = uVar14;
  }
  if (9 < uVar16) {
    uVar11 = (ulong)uVar16;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0017cabf;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0017cabf;
      }
      if (uVar7 < 10000) goto LAB_0017cabf;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_0017cabf:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar15 - (char)((int)uVar14 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_58._M_dataplus._M_p + (uVar14 >> 0x1f),uVar15,uVar16);
  puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x18c68a);
  local_98 = &local_88;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = puVar6[3];
  }
  else {
    local_88 = *plVar5;
    local_98 = (long *)*puVar6;
  }
  local_90 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  uVar16 = (uint)(local_38 * 100.0);
  paVar1 = &local_b8.field_2;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_b8.field_2._M_allocated_capacity = *puVar10;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar10;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar14 = -uVar16;
  if (0 < (int)uVar16) {
    uVar14 = uVar16;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0017cc22;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0017cc22;
      }
      if (uVar7 < 10000) goto LAB_0017cc22;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_0017cc22:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar15 - (char)((int)uVar16 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_78),uVar15,uVar14);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar12 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_70 + local_b8._M_string_length) {
    uVar11 = 0xf;
    if (local_78 != local_68) {
      uVar11 = local_68[0];
    }
    if (uVar11 < local_70 + local_b8._M_string_length) goto LAB_0017cc90;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_0017cc90:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar9) {
    uVar12 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  _Var13._M_p = local_58._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    return __return_storage_ptr__;
  }
LAB_0017caa2:
  operator_delete(_Var13._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string WbEngine::timeLeftString() const
{
    switch (timeController->mode) {
        case TimeControlMode::movetime:
        {
            auto centiSeconds = static_cast<int>(timeController->time * 100);
            auto s = std::to_string(centiSeconds);
            return "time " + s + "\notim " + s;
        }
            
        case TimeControlMode::standard:
        {
            // timeController unit: second -> centi second
            auto sd = static_cast<int>(board->side);
            auto time = int(timeController->getTimeLeft(sd) * 100);
            auto otime = int(timeController->getTimeLeft(1 - sd) * 100);
            return "time " + std::to_string(time) + "\notim " + std::to_string(otime);
        }
        default:
            break;
    }
    return "";
}